

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::TrackInstrsForScopeObjectRemoval(GlobOpt *this,Instr *instr)

{
  undefined4 uVar1;
  Opnd *pOVar2;
  Opnd *this_00;
  Func *func;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  ArgSlot AVar6;
  ushort uVar7;
  int iVar8;
  undefined4 *puVar9;
  JITTimeFunctionBody *pJVar10;
  StackSym *pSVar11;
  Func *pFVar12;
  undefined4 extraout_var;
  AddrOpnd *src1Opnd;
  RegOpnd *pRVar13;
  Instr *pIVar14;
  StackSym *pSVar15;
  ushort uVar16;
  short sVar17;
  Instr *pIVar18;
  StackSym *local_38;
  
  pOVar2 = instr->m_dst;
  if (instr->m_opcode == Ld_A) {
    this_00 = instr->m_src1;
    OVar4 = IR::Opnd::GetKind(this_00);
    if (((OVar4 == OpndKindReg) && (bVar5 = Func::IsStackArgsEnabled(instr->m_func), bVar5)) &&
       (bVar5 = IR::Opnd::IsScopeObjOpnd(this_00,instr->m_func), bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x57f,
                         "(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func))"
                         ,"There can be no aliasing for scope object.");
      if (!bVar5) goto LAB_00442440;
      *puVar9 = 0;
    }
  }
  bVar5 = Func::IsStackArgsEnabled(instr->m_func);
  if (!bVar5) {
    return;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    return;
  }
  if (instr->m_opcode != InlineeStart) {
    if (instr->m_opcode != LdSlotArr) {
      return;
    }
    bVar5 = IR::Opnd::IsScopeObjOpnd(instr->m_src1,instr->m_func);
    if (!bVar5) {
      return;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar5 = JITTimeFunctionBody::HasImplicitArgIns(pJVar10);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x589,"(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns())",
                         "No mapping is required in this case. So it should already be generating ArgIns."
                        );
      if (!bVar5) goto LAB_00442440;
      *puVar9 = 0;
    }
    pFVar12 = instr->m_func;
    pSVar11 = IR::Opnd::GetStackSym(pOVar2);
    Func::TrackFormalsArraySym(pFVar12,(pSVar11->super_Sym).m_id);
    return;
  }
  pFVar12 = instr->m_func;
  if (pFVar12->parentFunc == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x58f,"(instr->m_func->IsInlined())","instr->m_func->IsInlined()");
    if (!bVar5) goto LAB_00442440;
    *puVar9 = 0;
    pFVar12 = instr->m_func;
  }
  uVar1 = *(undefined4 *)&pFVar12->actualCount;
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pFVar12->m_workItem);
  AVar6 = JITTimeFunctionBody::GetInParamsCount(pJVar10);
  pFVar12 = instr->m_func;
  func = pFVar12->parentFunc;
  pSVar11 = IR::Opnd::GetStackSym(instr->m_src2);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar18 = (Instr *)0x0;
  }
  else {
    pIVar18 = (pSVar11->field_5).m_instrDef;
  }
  if ((instr->m_func->field_0x241 & 0x40) != 0) {
    pSVar11 = IR::Opnd::GetStackSym(pIVar18->m_src1);
    if (((pSVar11->field_0x18 & 1) != 0) && ((pSVar11->field_5).m_instrDef != (Instr *)0x0)) {
      pSVar11 = IR::Opnd::GetStackSym(pIVar18->m_src1);
      if ((pSVar11->field_0x18 & 1) == 0) {
        pIVar14 = (Instr *)0x0;
      }
      else {
        pIVar14 = (pSVar11->field_5).m_instrDef;
      }
      if (pIVar14->m_opcode != NewScObjectNoCtor) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x59e,
                           "(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                           ,
                           "argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor"
                          );
        if (!bVar5) {
LAB_00442440:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
    pSVar11 = IR::Opnd::GetStackSym(pIVar18->m_src2);
    if ((pSVar11->field_0x18 & 1) == 0) {
      pIVar18 = (Instr *)0x0;
    }
    else {
      pIVar18 = (pSVar11->field_5).m_instrDef;
    }
  }
  sVar17 = (short)uVar1;
  uVar7 = sVar17 - 1;
  uVar16 = AVar6 - 1;
  if (uVar16 < uVar7) {
    sVar17 = sVar17 - AVar6;
    if (sVar17 == 0) goto LAB_0044222c;
    do {
      pSVar11 = IR::Opnd::GetStackSym(pIVar18->m_src2);
      if ((pSVar11->field_0x18 & 1) == 0) {
        pIVar18 = (Instr *)0x0;
      }
      else {
        pIVar18 = (pSVar11->field_5).m_instrDef;
      }
      sVar17 = sVar17 + -1;
    } while (sVar17 != 0);
  }
  if (uVar16 == 0) {
    return;
  }
LAB_0044222c:
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pSVar11 = (StackSym *)0x0;
  do {
    if (pIVar18->m_src1 == (Opnd *)0x0) {
      local_38 = (StackSym *)0x0;
    }
    else {
      OVar4 = IR::Opnd::GetKind(pIVar18->m_src1);
      if (OVar4 == OpndKindReg) {
        local_38 = IR::Opnd::GetStackSym(pIVar18->m_src1);
      }
      else {
        local_38 = StackSym::New(func);
        pOVar2 = pIVar18->m_src1;
        pRVar13 = IR::RegOpnd::New(local_38,TyVar,func);
        pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,pOVar2,func);
        IR::Instr::InsertBefore(instr,pIVar14);
      }
    }
    AVar6 = uVar16 - 1;
    bVar5 = Func::HasStackSymForFormal(pFVar12,AVar6);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x5c3,"(!func->HasStackSymForFormal(param - 1))",
                         "!func->HasStackSymForFormal(param - 1)");
      if (!bVar5) goto LAB_00442440;
      *puVar9 = 0;
    }
    if (uVar7 < uVar16) {
      if (pSVar11 == (StackSym *)0x0) {
        pSVar11 = StackSym::New(func);
        iVar8 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
        src1Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar8),AddrOpndKindDynamicMisc,func,false
                                     ,(Var)0x0);
        pRVar13 = IR::RegOpnd::New(pSVar11,TyVar,func);
        pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,func);
        IR::Instr::InsertBefore(instr,pIVar14);
      }
      Func::TrackStackSymForFormalIndex(pFVar12,AVar6,pSVar11);
    }
    else {
      if (local_38 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x5c7,"(argOutSym)","argOutSym");
        if (!bVar5) goto LAB_00442440;
        *puVar9 = 0;
      }
      Func::TrackStackSymForFormalIndex(pFVar12,AVar6,local_38);
      pSVar15 = IR::Opnd::GetStackSym(pIVar18->m_src2);
      if ((pSVar15->field_0x18 & 1) == 0) {
        pIVar18 = (Instr *)0x0;
      }
      else {
        pIVar18 = (pSVar15->field_5).m_instrDef;
      }
    }
    uVar16 = AVar6;
    if (AVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void
GlobOpt::TrackInstrsForScopeObjectRemoval(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();

    if (instr->m_opcode == Js::OpCode::Ld_A && src1->IsRegOpnd())
    {
        AssertMsg(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func), "There can be no aliasing for scope object.");
    }

    // The following is to track formals array for Stack Arguments optimization with Formals
    if (instr->m_func->IsStackArgsEnabled() && !this->IsLoopPrePass())
    {
        if (instr->m_opcode == Js::OpCode::LdSlotArr)
        {
            if (instr->GetSrc1()->IsScopeObjOpnd(instr->m_func))
            {
                AssertMsg(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns(), "No mapping is required in this case. So it should already be generating ArgIns.");
                instr->m_func->TrackFormalsArraySym(dst->GetStackSym()->m_id);
            }
        }
        else if (instr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(instr->m_func->IsInlined());
            Js::ArgSlot actualsCount = instr->m_func->actualCount - 1;
            Js::ArgSlot formalsCount = instr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;

            Func * func = instr->m_func;
            Func * inlinerFunc = func->GetParentFunc(); //Inliner's func

            IR::Instr * argOutInstr = instr->GetSrc2()->GetStackSym()->GetInstrDef();

            //The argout immediately before the InlineeStart will be the ArgOut for NewScObject
            //So we don't want to track the stack sym for this argout.- Skipping it here.
            if (instr->m_func->IsInlinedConstructor())
            {
                //PRE might introduce a second defintion for the Src1. So assert for the opcode only when it has single definition.
                Assert(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr ||
                    argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor);
                argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
            }
            if (formalsCount < actualsCount)
            {
                Js::ArgSlot extraActuals = actualsCount - formalsCount;

                //Skipping extra actuals passed
                for (Js::ArgSlot i = 0; i < extraActuals; i++)
                {
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
            }

            StackSym * undefinedSym = nullptr;

            for (Js::ArgSlot param = formalsCount; param > 0; param--)
            {
                StackSym * argOutSym = nullptr;

                if (argOutInstr->GetSrc1())
                {
                    if (argOutInstr->GetSrc1()->IsRegOpnd())
                    {
                        argOutSym = argOutInstr->GetSrc1()->GetStackSym();
                    }
                    else
                    {
                        // We will always have ArgOut instr - so the source operand will not be removed.
                        argOutSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = argOutInstr->GetSrc1();
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(argOutSym, TyVar, inlinerFunc);
                        IR::Instr * assignInstr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignInstr);
                    }
                }

                Assert(!func->HasStackSymForFormal(param - 1));

                if (param <= actualsCount)
                {
                    Assert(argOutSym);
                    func->TrackStackSymForFormalIndex(param - 1, argOutSym);
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
                else
                {
                    /*When param is out of range of actuals count, load undefined*/
                    // TODO: saravind: This will insert undefined for each of the param not having an actual. - Clean up this by having a sym for undefined on func ?
                    Assert(formalsCount > actualsCount);
                    if (undefinedSym == nullptr)
                    {
                        undefinedSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = IR::AddrOpnd::New(inlinerFunc->GetScriptContextInfo()->GetUndefinedAddr(), IR::AddrOpndKindDynamicMisc, inlinerFunc);
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(undefinedSym, TyVar, inlinerFunc);
                        IR::Instr * assignUndefined = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignUndefined);
                    }
                    func->TrackStackSymForFormalIndex(param - 1, undefinedSym);
                }
            }
        }
    }
}